

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

int nn_msgqueue_send(nn_msgqueue *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  nn_msgqueue_chunk *pnVar5;
  int iVar6;
  
  sVar2 = nn_chunkref_size(&msg->sphdr);
  sVar3 = nn_chunkref_size(&msg->body);
  uVar4 = sVar3 + sVar2 + self->mem;
  if ((self->count == 0) || (uVar4 < self->maxmem)) {
    self->count = self->count + 1;
    self->mem = uVar4;
    nn_msg_mv(((self->out).chunk)->msgs + (self->out).pos,msg);
    iVar1 = (self->out).pos + 1;
    (self->out).pos = iVar1;
    iVar6 = 0;
    if (iVar1 == 0x7e) {
      pnVar5 = self->cache;
      if (pnVar5 == (nn_msgqueue_chunk *)0x0) {
        pnVar5 = (nn_msgqueue_chunk *)nn_alloc_(0x2f48);
        self->cache = pnVar5;
        if (pnVar5 == (nn_msgqueue_chunk *)0x0) {
          nn_backtrace_print();
          fprintf(_stderr,"Out of memory (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
                  ,0x69);
          fflush(_stderr);
          nn_err_abort();
        }
        pnVar5->next = (nn_msgqueue_chunk *)0x0;
      }
      ((self->out).chunk)->next = pnVar5;
      (self->out).chunk = pnVar5;
      self->cache = (nn_msgqueue_chunk *)0x0;
      (self->out).pos = 0;
    }
  }
  else {
    iVar6 = -0xb;
  }
  return iVar6;
}

Assistant:

int nn_msgqueue_send (struct nn_msgqueue *self, struct nn_msg *msg)
{
    size_t msgsz;

    /*  By allowing one message of arbitrary size to be written to the queue,
        we allow even messages that exceed max buffer size to pass through.
        Beyond that we'll apply the buffer limit as specified by the user. */
    msgsz = nn_chunkref_size (&msg->sphdr) + nn_chunkref_size (&msg->body);
    if (nn_slow (self->count > 0 && self->mem + msgsz >= self->maxmem))
        return -EAGAIN;

    /*  Adjust the statistics. */
    ++self->count;
    self->mem += msgsz;

    /*  Move the content of the message to the pipe. */
    nn_msg_mv (&self->out.chunk->msgs [self->out.pos], msg);
    ++self->out.pos;

    /*  If there's no space for a new message in the pipe, either re-use
        the cache chunk or allocate a new chunk if it does not exist. */
    if (nn_slow (self->out.pos == NN_MSGQUEUE_GRANULARITY)) {
        if (nn_slow (!self->cache)) {
            self->cache = nn_alloc (sizeof (struct nn_msgqueue_chunk),
                "msgqueue chunk");
            alloc_assert (self->cache);
            self->cache->next = NULL;
        }
        self->out.chunk->next = self->cache;
        self->out.chunk = self->cache;
        self->cache = NULL;
        self->out.pos = 0;
    }

    return 0;
}